

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O0

bool __thiscall
cmCPackNSISGenerator::GetListOfSubdirectories
          (cmCPackNSISGenerator *this,char *topdir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dirs)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  string *psVar5;
  allocator<char> local_c1;
  string local_c0 [32];
  undefined1 local_a0 [8];
  string fullPath;
  char *fileName;
  unsigned_long i;
  allocator<char> local_51;
  string local_50;
  Directory local_30;
  Directory dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dirs_local;
  char *topdir_local;
  cmCPackNSISGenerator *this_local;
  
  dir.Internal = (DirectoryInternals *)dirs;
  dirs_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)topdir;
  topdir_local = (char *)this;
  cmsys::Directory::Directory(&local_30);
  pvVar1 = dirs_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,(char *)pvVar1,&local_51);
  cmsys::Directory::Load(&local_30,&local_50,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  for (fileName = (char *)0x0; pcVar4 = (char *)cmsys::Directory::GetNumberOfFiles(&local_30),
      fileName < pcVar4; fileName = fileName + 1) {
    fullPath.field_2._8_8_ = cmsys::Directory::GetFile(&local_30,(unsigned_long)fileName);
    iVar3 = strcmp((char *)fullPath.field_2._8_8_,".");
    if ((iVar3 != 0) &&
       (iVar3 = strcmp((char *)fullPath.field_2._8_8_,".."), pvVar1 = dirs_local, iVar3 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_c0,(char *)pvVar1,&local_c1);
      pcVar4 = (char *)std::__cxx11::string::append((char *)local_c0);
      psVar5 = (string *)std::__cxx11::string::append(pcVar4);
      std::__cxx11::string::string((string *)local_a0,psVar5);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator(&local_c1);
      bVar2 = cmsys::SystemTools::FileIsDirectory((string *)local_a0);
      if ((!bVar2) || (bVar2 = cmsys::SystemTools::FileIsSymlink((string *)local_a0), bVar2)) {
LAB_00199247:
        bVar2 = false;
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        bVar2 = GetListOfSubdirectories
                          (this,pcVar4,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)dir.Internal);
        if (bVar2) goto LAB_00199247;
        this_local._7_1_ = 0;
        bVar2 = true;
      }
      std::__cxx11::string::~string((string *)local_a0);
      if (bVar2) goto LAB_0019929b;
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char_const*&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)dir.Internal,
             (char **)&dirs_local);
  this_local._7_1_ = 1;
LAB_0019929b:
  cmsys::Directory::~Directory(&local_30);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCPackNSISGenerator::GetListOfSubdirectories(
  const char* topdir, std::vector<std::string>& dirs)
{
  cmsys::Directory dir;
  dir.Load(topdir);
  for (unsigned long i = 0; i < dir.GetNumberOfFiles(); ++i) {
    const char* fileName = dir.GetFile(i);
    if (strcmp(fileName, ".") != 0 && strcmp(fileName, "..") != 0) {
      std::string const fullPath =
        std::string(topdir).append("/").append(fileName);
      if (cmsys::SystemTools::FileIsDirectory(fullPath) &&
          !cmsys::SystemTools::FileIsSymlink(fullPath)) {
        if (!this->GetListOfSubdirectories(fullPath.c_str(), dirs)) {
          return false;
        }
      }
    }
  }
  dirs.emplace_back(topdir);
  return true;
}